

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDGrammar::serialize(DTDGrammar *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  DTDGrammar *this_local;
  
  Grammar::serialize(&this->super_Grammar,serEng);
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XTemplateSerializer::storeObject(this->fElemDeclPool,serEng);
    XTemplateSerializer::storeObject(this->fEntityDeclPool,serEng);
    XTemplateSerializer::storeObject(this->fNotationDeclPool,serEng);
    (*(this->fGramDesc->super_XMLGrammarDescription).super_XSerializable._vptr_XSerializable[3])
              (this->fGramDesc,serEng);
    XSerializeEngine::operator<<(serEng,(bool)(this->fValidated & 1));
  }
  else {
    XTemplateSerializer::loadObject(&this->fElemDeclPool,0x6d,0x80,serEng);
    this->fElemNonDeclPool = (NameIdPool<xercesc_4_0::DTDElementDecl> *)0x0;
    XTemplateSerializer::loadObject(&this->fEntityDeclPool,0x6d,0x80,serEng);
    XTemplateSerializer::loadObject(&this->fNotationDeclPool,0x6d,0x80,serEng);
    (*(this->fGramDesc->super_XMLGrammarDescription).super_XSerializable._vptr_XSerializable[3])
              (this->fGramDesc,serEng);
    XSerializeEngine::operator>>(serEng,&this->fValidated);
  }
  return;
}

Assistant:

void DTDGrammar::serialize(XSerializeEngine& serEng)
{

    Grammar::serialize(serEng);

    //don't serialize fDefaultEntities

    if (serEng.isStoring())
    {
        /***
         *
         * Serialize NameIdPool<DTDElementDecl>*       fElemDeclPool;
         * Serialize NameIdPool<DTDEntityDecl>*        fEntityDeclPool;
         * Serialize NameIdPool<XMLNotationDecl>*      fNotationDeclPool;
         ***/
        XTemplateSerializer::storeObject(fElemDeclPool, serEng);
        XTemplateSerializer::storeObject(fEntityDeclPool, serEng);
        XTemplateSerializer::storeObject(fNotationDeclPool, serEng);

        /***
         * serialize() method shall be used to store object
         * which has been created in ctor
         ***/
        fGramDesc->serialize(serEng);

        serEng<<fValidated;
    }
    else
    {

       /***
         *
         * Deserialize NameIdPool<DTDElementDecl>*       fElemDeclPool;
         * Deserialize NameIdPool<DTDEntityDecl>*        fEntityDeclPool;
         * Deerialize NameIdPool<XMLNotationDecl>*       fNotationDeclPool;
         ***/
        XTemplateSerializer::loadObject(&fElemDeclPool, 109, 128, serEng);
        fElemNonDeclPool = 0;
        XTemplateSerializer::loadObject(&fEntityDeclPool, 109, 128, serEng);
        XTemplateSerializer::loadObject(&fNotationDeclPool, 109, 128, serEng);

        /***
         * serialize() method shall be used to load object
         * which has been created in ctor
         ***/
        fGramDesc->serialize(serEng);

        serEng>>fValidated;
    }

}